

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

int Gia_ManSatEnum(Gia_Man_t *pGia,int nConfLimit,int nTimeOut,int fVerbose)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Cnf_Dat_t *p;
  sat_solver *s;
  Vec_Int_t *p_00;
  lit *begin;
  int iVar5;
  int iVar6;
  int iVar7;
  char *__format;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  timespec ts;
  timespec local_70;
  uint local_60;
  uint local_5c;
  long local_58;
  int local_50;
  int local_4c;
  long local_48;
  ulong local_40;
  ABC_INT64_T local_38;
  
  local_60 = nConfLimit;
  local_4c = fVerbose;
  iVar3 = clock_gettime(3,&local_70);
  if (iVar3 < 0) {
    local_58 = -1;
  }
  else {
    local_58 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
  }
  local_5c = 1;
  p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  iVar3 = p->nVars;
  iVar4 = pGia->nRegs;
  iVar7 = pGia->vCis->nSize;
  Cnf_DataFree(p);
  iVar6 = pGia->vCis->nSize - pGia->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar5 = iVar6;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    begin = (lit *)0x0;
  }
  else {
    begin = (lit *)malloc((long)iVar5 << 2);
  }
  p_00->pArray = begin;
  local_38 = (ABC_INT64_T)(int)local_60;
  uVar10 = (iVar4 + iVar3) - iVar7;
  local_40 = (ulong)uVar10;
  local_48 = (long)nTimeOut;
  local_50 = uVar10 * 2;
  uVar8 = 0;
  while( true ) {
    iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,local_38,0,0,0);
    if (iVar3 == -1) break;
    if (iVar3 == 0) {
      bVar2 = false;
      iVar3 = 0;
      goto LAB_00796bc5;
    }
    p_00->nSize = 0;
    if (pGia->nRegs < pGia->vCis->nSize) {
      lVar9 = 0;
      uVar11 = local_40;
      iVar3 = local_50;
      do {
        if (((int)uVar11 < 0) || (s->size <= (int)uVar11)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        Vec_IntPush(p_00,(uint)(s->model[uVar11] == 1) + iVar3);
        lVar9 = lVar9 + 1;
        iVar3 = iVar3 + 2;
        uVar11 = uVar11 + 1;
      } while (lVar9 < (long)pGia->vCis->nSize - (long)pGia->nRegs);
    }
    if (local_4c == 0) {
      iVar3 = p_00->nSize;
    }
    else {
      printf("%5d : ",(ulong)local_5c);
      iVar3 = p_00->nSize;
      if (0 < (long)iVar3) {
        piVar1 = p_00->pArray;
        lVar9 = 0;
        do {
          if (piVar1[lVar9] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          printf("%d",(ulong)(~piVar1[lVar9] & 1));
          lVar9 = lVar9 + 1;
        } while (iVar3 != lVar9);
      }
      putchar(10);
    }
    uVar8 = (ulong)((int)uVar8 + 1);
    begin = p_00->pArray;
    iVar3 = sat_solver_addclause(s,begin,begin + iVar3);
    if (iVar3 == 0) break;
    if (nTimeOut != 0) {
      iVar3 = clock_gettime(3,&local_70);
      if (iVar3 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
      }
      if (local_48 <= (lVar9 - local_58) / 1000000) {
        bVar2 = false;
        iVar3 = 0;
        goto LAB_00796bc5;
      }
    }
    local_5c = local_5c + 1;
  }
  iVar3 = 1;
  bVar2 = true;
LAB_00796bc5:
  sat_solver_delete(s);
  if (begin != (lit *)0x0) {
    free(begin);
  }
  free(p_00);
  if (nTimeOut == 0) {
LAB_00796c55:
    if (local_60 == 0 || bVar2) {
      printf("Enumerated the complete set of %d assignments.  ",uVar8);
      goto LAB_00796c97;
    }
    __format = "Enumerated %d assignments when conflict limit (%d) was reached.  ";
    nTimeOut = local_60;
  }
  else {
    iVar4 = clock_gettime(3,&local_70);
    if (iVar4 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    if ((lVar9 - local_58) / 1000000 < local_48) goto LAB_00796c55;
    __format = "Enumerated %d assignments when timeout (%d sec) was reached.  ";
  }
  printf(__format,uVar8,(ulong)(uint)nTimeOut);
LAB_00796c97:
  iVar7 = 3;
  iVar4 = clock_gettime(3,&local_70);
  if (iVar4 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
  }
  lVar9 = lVar9 - local_58;
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)lVar9 / 1000000.0);
  return iVar3;
}

Assistant:

int Gia_ManSatEnum( Gia_Man_t * pGia, int nConfLimit, int nTimeOut, int fVerbose )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int i, iLit, iParVarBeg, Iter;
    int nSolutions = 0, RetValue = 0;
    abctime clkStart = Abc_Clock();
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    iParVarBeg = pCnf->nVars - Gia_ManPiNum(pGia);// - 1;
    Cnf_DataFree( pCnf );
    // iterate through the SAT assignment
    vLits = Vec_IntAlloc( Gia_ManPiNum(pGia) );
    for ( Iter = 1 ; ; Iter++ )
    {
        int status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, 0, 0 );
        if ( status == l_False ) { RetValue =  1; break; }
        if ( status == l_Undef ) { RetValue =  0; break; }
        nSolutions++;
        // extract SAT assignment
        Vec_IntClear( vLits );
        for ( i = 0; i < Gia_ManPiNum(pGia); i++ )
            Vec_IntPush( vLits, Abc_Var2Lit(iParVarBeg+i, sat_solver_var_value(pSat, iParVarBeg+i)) );
        if ( fVerbose )
        {
            printf( "%5d : ", Iter );
            Vec_IntForEachEntry( vLits, iLit, i )
                printf( "%d", !Abc_LitIsCompl(iLit) );
            printf( "\n" );
        }
        // add clause
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) ) )
            { RetValue =  1; break; }
        if ( nTimeOut && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= nTimeOut ) { RetValue = 0; break; }
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
    if ( nTimeOut && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= nTimeOut )
        printf( "Enumerated %d assignments when timeout (%d sec) was reached.  ", nSolutions, nTimeOut );
    else if ( nConfLimit && !RetValue )
        printf( "Enumerated %d assignments when conflict limit (%d) was reached.  ", nSolutions, nConfLimit );
    else 
        printf( "Enumerated the complete set of %d assignments.  ", nSolutions );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    return RetValue;
}